

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O3

void __thiscall
chaiscript::dispatch::Attribute_Access<int,_MyException>::Attribute_Access
          (Attribute_Access<int,_MyException> *this,offset_in_MyException_to_int t_attr)

{
  initializer_list<chaiscript::Type_Info> __l;
  initializer_list<chaiscript::Type_Info> __l_00;
  allocator_type local_61;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> local_60;
  Type_Info local_48;
  pointer_____offset_0x10___ *ppuStack_30;
  pointer_____offset_0x10___ *local_28;
  undefined8 uStack_20;
  
  local_28 = &MyException::typeinfo;
  uStack_20 = 0;
  local_48.m_flags = 0x10;
  local_48._20_4_ = 0;
  ppuStack_30 = &MyException::typeinfo;
  local_48.m_type_info = (type_info *)&int::typeinfo;
  local_48.m_bare_type_info = (type_info *)&int::typeinfo;
  __l._M_len = 2;
  __l._M_array = &local_48;
  Catch::clara::std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::vector
            (&local_60,__l,&local_61);
  Proxy_Function_Base::Proxy_Function_Base(&this->super_Proxy_Function_Base,&local_60,1);
  if (local_60.super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.
                    super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.
                          super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.
                          super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  (this->super_Proxy_Function_Base)._vptr_Proxy_Function_Base =
       (_func_int **)&PTR__Attribute_Access_005b1e68;
  local_28 = &MyException::typeinfo;
  uStack_20 = 0;
  local_48.m_flags = 0x10;
  local_48._20_4_ = 0;
  ppuStack_30 = &MyException::typeinfo;
  local_48.m_type_info = (type_info *)&int::typeinfo;
  local_48.m_bare_type_info = (type_info *)&int::typeinfo;
  __l_00._M_len = 2;
  __l_00._M_array = &local_48;
  Catch::clara::std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::vector
            (&this->m_param_types,__l_00,&local_61);
  this->m_attr = t_attr;
  return;
}

Assistant:

explicit Attribute_Access(T Class::*t_attr)
          : Proxy_Function_Base(param_types(), 1)
          , m_attr(t_attr) {
      }